

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O3

_Bool borg_equips_dragon(wchar_t drag_sval)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  uVar3 = (ulong)z_info->pack_size;
  if ((((borg_items[uVar3 + 6].iqty != '\0') && (borg_items[uVar3 + 6].aware == true)) &&
      (borg_items[uVar3 + 6].tval == '\x12')) &&
     ((((uint)borg_items[uVar3 + 6].sval == drag_sval && (borg_items[uVar3 + 6].timeout == 0)) &&
      (borg_items[uVar3 + 6].ident == true)))) {
    iVar2 = borg.trait[0x38];
    if (borg.trait[0x72] != 0) {
      iVar2 = (iVar2 * 0x4b) / 100;
    }
    iVar4 = iVar2 - (uint)borg_items[uVar3 + 6].level;
    iVar1 = ((uint)borg_items[uVar3 + 6].level - iVar2) + -0x5a;
    iVar2 = (uint)(0x8c < iVar4) * 2 + -1;
    if (iVar1 != 0) {
      iVar2 = iVar1;
    }
    return (iVar4 * 100 + -14000) / iVar2 < 0x1f5;
  }
  return false;
}

Assistant:

bool borg_equips_dragon(int drag_sval)
{
    int lev, fail;
    int skill;
    int numerator;
    int denominator;

    /* Check the equipment */
    borg_item *item = &borg_items[INVEN_BODY];

    if (!item->iqty || !item->aware)
        return false;

    /* Skip incorrect armours */
    if (item->tval != TV_DRAG_ARMOR)
        return false;
    if (item->sval != drag_sval)
        return false;

    /* Check charge */
    if (item->timeout)
        return false;

    /*  Make Sure Mail is IDed */
    if (!item->ident)
        return false;

    /* check on fail rate
     * The fail check is automatic for dragon armor.  It is an attack
     * item.  He should not sit around failing 5 or 6 times in a row.
     * he should attempt to activate it, and if he is likely to fail, then
     * eh should look at a different attack option.  We are assuming
     * that the fail rate is about 50%.  So He may still try to activate it
     * and fail.  But he will not even try if he has negative chance or
     * less than twice the USE_DEVICE variable
     */
    /* Extract the item level */
    lev = item->level;

    /* Base chance of success */
    skill = borg.trait[BI_DEV];

    /* Confusion hurts skill */
    if (borg.trait[BI_ISCONFUSED])
        skill = skill * 75 / 100;

    /* High level objects are harder */
    numerator   = (skill - lev) - (141 - 1);
    denominator = (lev - skill) - (100 - 10);

    /* Make sure that we don't divide by zero */
    if (denominator == 0)
        denominator = numerator > 0 ? 1 : -1;

    fail = (100 * numerator) / denominator;

    /* Roll for usage, but if its a Teleport be generous. */
    if (fail > 500)
        return false;

    /* Success */
    return true;
}